

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prmonutils.cpp
# Opt level: O1

void prmon::snip_string_and_test
               (char *env_string,uint start,uint pos,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *disabled_monitors)

{
  bool bVar1;
  string monitor_name;
  string local_68;
  value_type local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,env_string + start,env_string + start + (pos - start));
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  bVar1 = valid_monitor_disable(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(disabled_monitors,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void snip_string_and_test(char *env_string, unsigned start, unsigned pos,
                          std::vector<std::string> &disabled_monitors) {
  std::string monitor_name(env_string + start, pos - start);
  if (valid_monitor_disable(monitor_name))
    disabled_monitors.push_back(monitor_name);
}